

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnumDescriptor.cpp
# Opt level: O3

KBOOL KDIS::DATA_TYPE::ENUMS::GetEnumFromString
                (EnumDescriptor *pArray,KUINT32 NumElements,KString *Value,KINT32 *ValueOut)

{
  int iVar1;
  ulong uVar2;
  KBOOL KVar3;
  
  if (NumElements == 0) {
    return false;
  }
  iVar1 = std::__cxx11::string::compare((char *)Value);
  if (iVar1 == 0) {
    KVar3 = true;
  }
  else {
    uVar2 = 0;
    do {
      if ((ulong)NumElements - 1 == uVar2) {
        return false;
      }
      iVar1 = std::__cxx11::string::compare((char *)Value);
      pArray = pArray + 1;
      uVar2 = uVar2 + 1;
    } while (iVar1 != 0);
    KVar3 = uVar2 < NumElements;
  }
  *ValueOut = pArray->Value;
  return KVar3;
}

Assistant:

KBOOL KDIS::DATA_TYPE::ENUMS::GetEnumFromString( const EnumDescriptor * pArray, KUINT32 NumElements, const KString & Value, KINT32 & ValueOut )
{
    for( KINT32 i = 0; i < NumElements; ++i )
    {
        if( Value == pArray[i].Name )
        {
            ValueOut = pArray[i].Value;
            return true;
        }
    }

    // No match found
    return false;
}